

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

iterator_base<true> * __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::iterator_base<true>::operator++(iterator_base<true> *this)

{
  bool bVar1;
  iterator_base<true> *this_local;
  
  std::
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
  ::reset(&this->pos_,(pointer)0x0);
  bVar1 = array_stack<pstore::index::details::parent_type,_13UL>::empty(&this->visited_parents_);
  if (!bVar1) {
    increment_internal_node(this);
    return this;
  }
  assert_failed("!visited_parents_.empty ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0x213);
}

Assistant:

auto
        hamt_map<KeyType, ValueType, Hash, KeyEqual>::iterator_base<IsConstIterator>::operator++ ()
            -> iterator_base & {
            pos_.reset ();
            PSTORE_ASSERT (!visited_parents_.empty ());
            this->increment_internal_node ();
            return *this;
        }